

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int deflateSetDictionary(z_streamp_conflict strm,Bytef *dictionary,uInt dictLength)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  internal_state_conflict *piVar4;
  byte *pbVar5;
  Posf *pPVar6;
  Posf *pPVar7;
  uLong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  iVar12 = -2;
  if ((strm != (z_streamp_conflict)0x0) &&
     (piVar4 = strm->state, dictionary != (Bytef *)0x0 && piVar4 != (internal_state_conflict *)0x0))
  {
    iVar12 = piVar4->wrap;
    if (iVar12 != 0) {
      if (iVar12 == 2) {
        return -2;
      }
      if ((iVar12 == 1) && (piVar4->status != 0x2a)) {
        return -2;
      }
      uVar8 = adler32(strm->adler,dictionary,dictLength);
      strm->adler = uVar8;
    }
    iVar12 = 0;
    if (2 < dictLength) {
      uVar2 = piVar4->w_size;
      iVar12 = 0;
      uVar11 = (ulong)(dictLength - uVar2);
      if (dictLength < uVar2) {
        uVar11 = 0;
      }
      if (uVar2 < dictLength) {
        dictLength = uVar2;
      }
      memcpy(piVar4->window,dictionary + uVar11,(ulong)dictLength);
      piVar4->strstart = dictLength;
      piVar4->block_start = (ulong)dictLength;
      pbVar5 = piVar4->window;
      bVar1 = *pbVar5;
      piVar4->ins_h = (uint)bVar1;
      bVar9 = (byte)piVar4->hash_shift;
      uVar2 = piVar4->hash_mask;
      uVar10 = ((uint)pbVar5[1] ^ (uint)bVar1 << (bVar9 & 0x1f)) & uVar2;
      piVar4->ins_h = uVar10;
      pPVar6 = piVar4->head;
      pPVar7 = piVar4->prev;
      uVar3 = piVar4->w_mask;
      uVar11 = 0;
      do {
        uVar10 = ((uint)pbVar5[(uint)uVar11 + 2] ^ uVar10 << (bVar9 & 0x1f)) & uVar2;
        piVar4->ins_h = uVar10;
        pPVar7[uVar3 & (uint)uVar11] = pPVar6[uVar10];
        pPVar6[uVar10] = (Posf)uVar11;
        uVar11 = uVar11 + 1;
      } while ((dictLength - 2) + (uint)(dictLength == 2) != uVar11);
    }
  }
  return iVar12;
}

Assistant:

int ZEXPORT deflateSetDictionary (z_streamp strm, const Bytef *dictionary, uInt  dictLength)
{
    deflate_state *s;
    uInt length = dictLength;
    uInt n;
    IPos hash_head = 0;

    if (strm == Z_NULL || strm->state == Z_NULL || dictionary == Z_NULL ||
        strm->state->wrap == 2 ||
        (strm->state->wrap == 1 && strm->state->status != INIT_STATE))
        return Z_STREAM_ERROR;

    s = strm->state;
    if (s->wrap)
        strm->adler = adler32(strm->adler, dictionary, dictLength);

    if (length < MIN_MATCH) return Z_OK;
    if (length > s->w_size) {
        length = s->w_size;
        dictionary += dictLength - length; /* use the tail of the dictionary */
    }
    zmemcpy(s->window, dictionary, length);
    s->strstart = length;
    s->block_start = (long)length;

    /* Insert all strings in the hash table (except for the last two bytes).
     * s->lookahead stays null, so s->ins_h will be recomputed at the next
     * call of fill_window.
     */
    s->ins_h = s->window[0];
    UPDATE_HASH(s, s->ins_h, s->window[1]);
    for (n = 0; n <= length - MIN_MATCH; n++) {
        INSERT_STRING(s, n, hash_head);
    }
    if (hash_head) hash_head = 0;  /* to make compiler happy */
    return Z_OK;
}